

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

int fy_emit_document_start(fy_emitter *emit,fy_document *fyd,fy_node *fyn_root)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if (fyd == (fy_document *)0x0 || emit == (fy_emitter *)0x0) {
    return -1;
  }
  if (fyd->fyds != (fy_document_state *)0x0) {
    if (((fyn_root != (fy_node *)0x0) ||
        (fyn_root = fy_document_root(fyd), fyn_root != (fy_node *)0x0)) &&
       (fyn_root->tag == (fy_token *)0x0)) {
      fy_document_lookup_anchor_by_node(fyd,fyn_root);
    }
    iVar1 = fy_emit_common_document_start(emit,fyd->fyds,false);
    if (iVar1 == 0) {
      emit->fyd = fyd;
      iVar2 = 0;
    }
    return iVar2;
  }
  return -1;
}

Assistant:

int fy_emit_document_start(struct fy_emitter *emit, struct fy_document *fyd,
                           struct fy_node *fyn_root) {
    struct fy_node *root;
    bool root_tag_or_anchor;
    int ret;

    if (!emit || !fyd || !fyd->fyds)
        return -1;

    root = fyn_root ?: fy_document_root(fyd);

    root_tag_or_anchor = root && (root->tag || fy_document_lookup_anchor_by_node(fyd, root));

    ret = fy_emit_common_document_start(emit, fyd->fyds, root_tag_or_anchor);
    if (ret)
        return ret;

    emit->fyd = fyd;

    return 0;
}